

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectSingleArgIgnore
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_4)

{
  string_view arg;
  SimplePragmaExpressionSyntax *pSVar1;
  SyntaxNode *in_RCX;
  Preprocessor *in_RDI;
  size_t in_R8;
  SourceRange SVar2;
  SourceRange range;
  SourceLocation this_00;
  SourceRange in_stack_ffffffffffffffa0;
  Token *in_stack_ffffffffffffffb0;
  undefined1 auVar3 [12];
  
  if (((in_RCX != (SyntaxNode *)0x0) && (in_RCX->kind == SimplePragmaExpression)) &&
     (pSVar1 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(in_RCX),
     (pSVar1->value).kind == StringLiteral)) {
    return;
  }
  if (in_RCX == (SyntaxNode *)0x0) {
    SVar2 = Token::range(in_stack_ffffffffffffffb0);
    auVar3 = SVar2._4_12_;
  }
  else {
    SVar2 = slang::syntax::SyntaxNode::sourceRange(in_RCX);
    auVar3 = SVar2._4_12_;
  }
  this_00 = in_stack_ffffffffffffffa0.startLoc;
  addDiag(in_RDI,auVar3._0_4_,in_stack_ffffffffffffffa0);
  Token::valueText((Token *)this_00);
  arg._M_str = (char *)in_RCX;
  arg._M_len = in_R8;
  Diagnostic::operator<<(auVar3._4_8_,arg);
  return;
}

Assistant:

void Preprocessor::handleProtectSingleArgIgnore(Token keyword, const PragmaExpressionSyntax* args,
                                                SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::SimplePragmaExpression ||
        args->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {

        SourceRange range = args ? args->sourceRange() : keyword.range();
        addDiag(diag::ExpectedProtectArg, range) << keyword.valueText();
    }
}